

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

void __thiscall hta::Metric::check_write(Metric *this)

{
  int iVar1;
  pointer pMVar2;
  Exception *this_00;
  allocator<char> local_31;
  string local_30;
  Metric *local_10;
  Metric *this_local;
  
  local_10 = this;
  pMVar2 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
           operator->(&this->storage_metric_);
  iVar1 = (*pMVar2->_vptr_Metric[1])();
  if (iVar1 != 0) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"attempting to write to metric opened for read only.",&local_31);
  Exception::Exception(this_00,&local_30);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Metric::check_write() const
{
    switch (storage_metric_->mode())
    {
    case Mode::write:
    case Mode::read_write:
        return;
    case Mode::read:
        throw Exception("attempting to write to metric opened for read only.");
    }
}